

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O1

uint32_t __thiscall
llvm::DWARFDebugLine::LineTable::lookupAddressImpl(LineTable *this,SectionedAddress Address)

{
  Sequence *pSVar1;
  bool bVar2;
  uint32_t uVar3;
  difference_type __d;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  Sequence *Seq;
  undefined1 local_50 [8];
  Sequence Sequence;
  
  uVar6 = Address.SectionIndex;
  DWARFDebugLine::Sequence::Sequence((Sequence *)local_50);
  Seq = (this->Sequences).
        super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->Sequences).
           super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar4 = (long)pSVar1 - (long)Seq;
  if (0 < (long)uVar4) {
    uVar4 = (uVar4 >> 3) * -0x3333333333333333;
    do {
      uVar5 = uVar4 >> 1;
      bVar2 = true;
      if (Seq[uVar5].SectionIndex <= uVar6) {
        if (Seq[uVar5].SectionIndex < uVar6) {
          bVar2 = false;
        }
        else {
          bVar2 = Address.Address < Seq[uVar5].HighPC;
        }
      }
      if (!bVar2) {
        Seq = Seq + uVar5 + 1;
        uVar5 = ~uVar5 + uVar4;
      }
      uVar4 = uVar5;
    } while (0 < (long)uVar5);
  }
  if ((Seq == pSVar1) || (Seq->SectionIndex != uVar6)) {
    uVar3 = this->UnknownRowIndex;
  }
  else {
    Sequence.LowPC = Address.Address;
    Sequence.HighPC = uVar6;
    uVar3 = findRowInSeq(this,Seq,Address);
  }
  return uVar3;
}

Assistant:

uint32_t DWARFDebugLine::LineTable::lookupAddressImpl(
    object::SectionedAddress Address) const {
  // First, find an instruction sequence containing the given address.
  DWARFDebugLine::Sequence Sequence;
  Sequence.SectionIndex = Address.SectionIndex;
  Sequence.HighPC = Address.Address;
  SequenceIter It = llvm::upper_bound(Sequences, Sequence,
                                      DWARFDebugLine::Sequence::orderByHighPC);
  if (It == Sequences.end() || It->SectionIndex != Address.SectionIndex)
    return UnknownRowIndex;
  return findRowInSeq(*It, Address);
}